

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcr.c
# Opt level: O2

void gcarrangementstack(void)

{
  LispPTR *pLVar1;
  LispPTR LVar2;
  
  pLVar1 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar1 = MachineState.tosvalue;
  MachineState.csp = MachineState.csp + 2;
  LVar2 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (DLword)LVar2;
  if ((DLword *)CONCAT44(MachineState.endofstack._4_4_,(int)MachineState.endofstack) ==
      MachineState.csp) {
    error("creating 0-long stack block.");
  }
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  return;
}

Assistant:

void gcarrangementstack(void) {
  LispPTR tmpnextblock;
  PushCStack;
  tmpnextblock = LAddrFromNative(CurrentStackPTR += DLWORDSPER_CELL);
  CURRENTFX->nextblock = LOLOC(tmpnextblock);
  if ((UNSIGNED)EndSTKP == (UNSIGNED)CurrentStackPTR) error("creating 0-long stack block.");
  GETWORD(CurrentStackPTR) = STK_FSB_WORD;
  GETWORD(CurrentStackPTR + 1) = (((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
}